

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.cc
# Opt level: O1

bool __thiscall
sptk::RealValuedFastFourierTransform::Run
          (RealValuedFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  ulong uVar1;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  double *pdVar6;
  double *pdVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar8 = false;
  bVar9 = false;
  if (((buffer != (Buffer *)0x0) &&
      (bVar9 = bVar8, imag_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar12 = this->num_order_;
    uVar1 = (long)iVar12 + 1;
    if ((long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar1) {
      this_00 = &buffer->real_part_input_;
      if ((long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != (long)this->half_fft_length_) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->half_fft_length_);
      }
      this_01 = &buffer->imag_part_input_;
      if ((long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != (long)this->half_fft_length_) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,(long)this->half_fft_length_);
      }
      if ((ulong)((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) <
          (ulong)(long)this->fft_length_) {
        std::vector<double,_std::allocator<double>_>::reserve
                  (real_part_output,(long)this->fft_length_);
      }
      if ((ulong)((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) <
          (ulong)(long)this->fft_length_) {
        std::vector<double,_std::allocator<double>_>::reserve
                  (imag_part_output,(long)this->fft_length_);
      }
      if (-1 < iVar12) {
        pdVar4 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0;
        do {
          *(double *)((long)pdVar5 + uVar11 * 4) = pdVar4[uVar11];
          if ((ulong)(long)iVar12 <= uVar11) break;
          *(double *)
           ((long)(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + uVar11 * 4) = pdVar4[uVar11 + 1];
          uVar11 = uVar11 + 2;
        } while ((int)uVar11 <= iVar12);
      }
      pdVar5 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pdVar4 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + ((iVar12 - (iVar12 + 2 >> 0x1f)) + 2 >> 1)
      ;
      if (pdVar4 != pdVar5) {
        memset(pdVar4,0,((long)pdVar5 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
      }
      pdVar5 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pdVar4 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start +
               ((int)(((uint)(uVar1 >> 0x1f) & 1) + (int)uVar1) >> 1);
      if (pdVar4 != pdVar5) {
        memset(pdVar4,0,((long)pdVar5 + (-8 - (long)pdVar4) & 0xfffffffffffffff8U) + 8);
      }
      bVar9 = FastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,this_01,real_part_output,
                         imag_part_output);
      if (bVar9) {
        std::vector<double,_std::allocator<double>_>::resize
                  (real_part_output,(long)this->fft_length_);
        std::vector<double,_std::allocator<double>_>::resize
                  (imag_part_output,(long)this->fft_length_);
        pdVar6 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar12 = this->fft_length_;
        lVar13 = (long)iVar12;
        uVar3 = this->half_fft_length_;
        lVar10 = (long)(int)uVar3;
        pdVar6[lVar10] = *pdVar6 - *pdVar7;
        *pdVar6 = *pdVar6 + *pdVar7;
        pdVar7[lVar10] = 0.0;
        *pdVar7 = 0.0;
        if (1 < lVar10) {
          pdVar4 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar14 = iVar12 + 3;
          if (-1 < iVar12) {
            iVar14 = iVar12;
          }
          iVar12 = uVar3 - 1;
          lVar10 = (long)(iVar14 >> 2) * 8 + 8;
          lVar16 = -1;
          lVar15 = 0;
          do {
            dVar2 = *(double *)((long)pdVar6 + lVar15 + 8);
            dVar17 = dVar2 - pdVar6[(ulong)uVar3 + lVar16];
            dVar18 = *(double *)((long)pdVar7 + lVar15 + 8) + pdVar7[(ulong)uVar3 + lVar16];
            pdVar6[lVar13 + lVar16] =
                 ((*(double *)((long)pdVar4 + lVar15 + lVar10) * dVar18 +
                  dVar2 + pdVar6[(ulong)uVar3 + lVar16]) -
                 *(double *)((long)pdVar4 + lVar15 + 8) * dVar17) * 0.5;
            pdVar7[lVar13 + lVar16] =
                 (dVar17 * *(double *)((long)pdVar4 + lVar15 + lVar10) +
                 dVar18 * *(double *)((long)pdVar4 + lVar15 + 8) +
                 (pdVar7[(ulong)uVar3 + lVar16] - *(double *)((long)pdVar7 + lVar15 + 8))) * 0.5;
            lVar16 = lVar16 + -1;
            lVar15 = lVar15 + 8;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        bVar9 = true;
        if (1 < (int)uVar3) {
          lVar10 = 1;
          do {
            lVar13 = lVar13 + -1;
            pdVar6[lVar10] = pdVar6[lVar13];
            pdVar7[lVar10] = -pdVar7[lVar13];
            lVar10 = lVar10 + 1;
          } while (uVar3 != (uint)lVar10);
        }
      }
      else {
        bVar9 = false;
      }
    }
  }
  return bVar9;
}

Assistant:

bool RealValuedFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    RealValuedFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_order_ + 1);
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(input_length) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->real_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->real_part_input_.resize(half_fft_length_);
  }
  if (buffer->imag_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->imag_part_input_.resize(half_fft_length_);
  }
  if (real_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    real_part_output->reserve(fft_length_);
  }
  if (imag_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    imag_part_output->reserve(fft_length_);
  }

  // Copy input and fill zero.
  for (int i(0), j(0); i < input_length; ++j) {
    buffer->real_part_input_[j] = real_part_input[i++];
    if (input_length <= i) break;
    buffer->imag_part_input_[j] = real_part_input[i++];
  }
  std::fill(buffer->real_part_input_.begin() + (input_length + 1) / 2,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + input_length / 2,
            buffer->imag_part_input_.end(), 0.0);

  // Run fast Fourier transform.
  if (!fast_fourier_transform_.Run(buffer->real_part_input_,
                                   buffer->imag_part_input_, real_part_output,
                                   imag_part_output)) {
    return false;
  }
  real_part_output->resize(fft_length_);
  imag_part_output->resize(fft_length_);

  double* x(&((*real_part_output)[0]));
  double* y(&((*imag_part_output)[0]));
  double* xp(x);
  double* yp(y);
  double* xq(xp + fft_length_);
  double* yq(yp + fft_length_);
  *(xp + half_fft_length_) = *xp - *yp;
  *xp = *xp + *yp;
  *(yp + half_fft_length_) = 0.0;
  *yp = 0.0;

  const double* sinp(&(sine_table_[0]));
  const double* cosp(&(sine_table_[0]) + fft_length_ / 4);
  for (int i(1), j(half_fft_length_ - 2); i < half_fft_length_; ++i, j -= 2) {
    ++xp;
    ++yp;
    ++sinp;
    ++cosp;
    const double xt(*xp - *(xp + j));
    const double yt(*yp + *(yp + j));
    *(--xq) = (*xp + *(xp + j) + *cosp * yt - *sinp * xt) * 0.5;
    *(--yq) = (-*yp + *(yp + j) + *sinp * yt + *cosp * xt) * 0.5;
  }

  xp = x + 1;
  yp = y + 1;
  xq = x + fft_length_;
  yq = y + fft_length_;
  for (int i(1); i < half_fft_length_; ++i) {
    *xp++ = *(--xq);
    *yp++ = -(*(--yq));
  }

  return true;
}